

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int big2_scanAtts(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  uint local_94;
  uint local_84;
  uint local_74;
  uint local_6c;
  uint local_64;
  uint local_54;
  uint local_48;
  int tok;
  int t_1;
  int open;
  int t;
  int hadColon;
  char **nextTokPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  bVar2 = false;
  end_local = ptr;
  ptr_local = (char *)enc;
LAB_001abc12:
  do {
    if (end_local == end) {
      return -1;
    }
    if (*end_local == '\0') {
      local_48 = (uint)(byte)ptr_local[(ulong)(byte)end_local[1] + 0x90];
    }
    else {
      local_48 = unicode_byte_type(*end_local,end_local[1]);
    }
    switch(local_48) {
    case 5:
      if ((long)end - (long)end_local < 2) {
        return -2;
      }
      *nextTokPtr = end_local;
      return 0;
    case 6:
      if ((long)end - (long)end_local < 3) {
        return -2;
      }
      *nextTokPtr = end_local;
      return 0;
    case 7:
      if ((long)end - (long)end_local < 4) {
        return -2;
      }
      *nextTokPtr = end_local;
      return 0;
    default:
      *nextTokPtr = end_local;
      return 0;
    case 9:
    case 10:
    case 0x15:
      while( true ) {
        pcVar4 = end_local + 2;
        if (pcVar4 == end) {
          return -1;
        }
        if (*pcVar4 == '\0') {
          local_64 = (uint)(byte)ptr_local[(ulong)(byte)end_local[3] + 0x90];
          end_local = pcVar4;
        }
        else {
          pcVar1 = end_local + 3;
          end_local = pcVar4;
          local_64 = unicode_byte_type(*pcVar4,*pcVar1);
        }
        if (local_64 == 0xe) break;
        if ((1 < local_64 - 9) && (local_64 != 0x15)) {
          *nextTokPtr = end_local;
          return 0;
        }
      }
    case 0xe:
      bVar2 = false;
      while( true ) {
        pcVar4 = end_local + 2;
        if (pcVar4 == end) {
          return -1;
        }
        if (*pcVar4 == '\0') {
          local_6c = (uint)(byte)ptr_local[(ulong)(byte)end_local[3] + 0x90];
          end_local = pcVar4;
        }
        else {
          pcVar1 = end_local + 3;
          end_local = pcVar4;
          local_6c = unicode_byte_type(*pcVar4,*pcVar1);
        }
        if ((local_6c == 0xc) || (local_6c == 0xd)) break;
        if ((1 < local_6c - 9) && (local_6c != 0x15)) {
          *nextTokPtr = end_local;
          return 0;
        }
      }
      end_local = end_local + 2;
      while( true ) {
        if (end_local == end) {
          return -1;
        }
        if (*end_local == '\0') {
          local_74 = (uint)(byte)ptr_local[(ulong)(byte)end_local[1] + 0x90];
        }
        else {
          local_74 = unicode_byte_type(*end_local,end_local[1]);
        }
        if (local_74 == local_6c) break;
        switch(local_74) {
        case 0:
        case 1:
        case 8:
          *nextTokPtr = end_local;
          return 0;
        case 2:
          *nextTokPtr = end_local;
          return 0;
        case 3:
          iVar3 = big2_scanRef((ENCODING *)ptr_local,end_local + 2,end,&end_local);
          if (iVar3 < 1) {
            if (iVar3 != 0) {
              return iVar3;
            }
            *nextTokPtr = end_local;
            return 0;
          }
          break;
        default:
          end_local = end_local + 2;
          break;
        case 5:
          if ((long)end - (long)end_local < 2) {
            return -2;
          }
          end_local = end_local + 2;
          break;
        case 6:
          if ((long)end - (long)end_local < 3) {
            return -2;
          }
          end_local = end_local + 3;
          break;
        case 7:
          if ((long)end - (long)end_local < 4) {
            return -2;
          }
          end_local = end_local + 4;
        }
      }
      pcVar4 = end_local + 2;
      if (pcVar4 == end) {
        return -1;
      }
      if (*pcVar4 == '\0') {
        local_84 = (uint)(byte)ptr_local[(ulong)(byte)end_local[3] + 0x90];
        end_local = pcVar4;
      }
      else {
        pcVar1 = end_local + 3;
        end_local = pcVar4;
        local_84 = unicode_byte_type(*pcVar4,*pcVar1);
      }
      switch(local_84) {
      case 9:
      case 10:
      case 0x15:
        break;
      case 0xb:
LAB_001ac4d0:
        *nextTokPtr = end_local + 2;
        return 1;
      default:
        *nextTokPtr = end_local;
        return 0;
      case 0x11:
LAB_001ac4ed:
        pcVar4 = end_local + 2;
        if (pcVar4 == end) {
          return -1;
        }
        if ((*pcVar4 == '\0') && (end_local[3] == '>')) {
          *nextTokPtr = end_local + 4;
          return 3;
        }
        *nextTokPtr = pcVar4;
        return 0;
      }
      do {
        pcVar4 = end_local + 2;
        if (pcVar4 == end) {
          return -1;
        }
        if (*pcVar4 == '\0') {
          local_94 = (uint)(byte)ptr_local[(ulong)(byte)end_local[3] + 0x90];
          end_local = pcVar4;
        }
        else {
          pcVar1 = end_local + 3;
          end_local = pcVar4;
          local_94 = unicode_byte_type(*pcVar4,*pcVar1);
        }
        switch(local_94) {
        case 5:
          if ((long)end - (long)end_local < 2) {
            return -2;
          }
          *nextTokPtr = end_local;
          return 0;
        case 6:
          if ((long)end - (long)end_local < 3) {
            return -2;
          }
          *nextTokPtr = end_local;
          return 0;
        case 7:
          if ((long)end - (long)end_local < 4) {
            return -2;
          }
          *nextTokPtr = end_local;
          return 0;
        default:
          *nextTokPtr = end_local;
          return 0;
        case 9:
        case 10:
        case 0x15:
          break;
        case 0xb:
          goto LAB_001ac4d0;
        case 0x11:
          goto LAB_001ac4ed;
        case 0x16:
        case 0x18:
          goto switchD_001ac3b5_caseD_16;
        case 0x1d:
          if ((namingBitmap
               [(int)((uint)"\x02\x03\x04\x05\x06\a\b"[(byte)*end_local] * 8 +
                     ((int)(uint)(byte)end_local[1] >> 5))] & 1 << (end_local[1] & 0x1fU)) == 0) {
            *nextTokPtr = end_local;
            return 0;
          }
          goto switchD_001ac3b5_caseD_16;
        }
      } while( true );
    case 0x17:
      if (bVar2) {
        *nextTokPtr = end_local;
        return 0;
      }
      bVar2 = true;
      pcVar4 = end_local + 2;
      if (pcVar4 == end) {
        return -1;
      }
      if (*pcVar4 == '\0') {
        local_54 = (uint)(byte)ptr_local[(ulong)(byte)end_local[3] + 0x90];
        end_local = pcVar4;
      }
      else {
        pcVar1 = end_local + 3;
        end_local = pcVar4;
        local_54 = unicode_byte_type(*pcVar4,*pcVar1);
      }
      switch(local_54) {
      case 5:
        if ((long)end - (long)end_local < 2) {
          return -2;
        }
        *nextTokPtr = end_local;
        return 0;
      case 6:
        if ((long)end - (long)end_local < 3) {
          return -2;
        }
        *nextTokPtr = end_local;
        return 0;
      case 7:
        if ((long)end - (long)end_local < 4) {
          return -2;
        }
        *nextTokPtr = end_local;
        return 0;
      default:
        *nextTokPtr = end_local;
        return 0;
      case 0x1d:
        if ((namingBitmap
             [(int)((uint)"\x02\x03\x04\x05\x06\a\b"[(byte)*end_local] * 8 +
                   ((int)(uint)(byte)end_local[1] >> 5))] & 1 << (end_local[1] & 0x1fU)) == 0) {
          *nextTokPtr = end_local;
          return 0;
        }
      case 0x16:
      case 0x18:
        end_local = end_local + 2;
      }
      break;
    case 0x1d:
      if ((namingBitmap
           [(int)((uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[(byte)*end_local] * 8 +
                 ((int)(uint)(byte)end_local[1] >> 5))] & 1 << (end_local[1] & 0x1fU)) == 0) {
        *nextTokPtr = end_local;
        return 0;
      }
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      end_local = end_local + 2;
    }
  } while( true );
switchD_001ac3b5_caseD_16:
  end_local = end_local + 2;
  goto LAB_001abc12;
}

Assistant:

static
int PREFIX(scanAtts)(const ENCODING *enc, const char *ptr, const char *end,
                     const char **nextTokPtr)
{
#ifdef XML_NS
  int hadColon = 0;
#endif
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
#ifdef XML_NS
    case BT_COLON:
      if (hadColon) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      hadColon = 1;
      ptr += MINBPC(enc);
      if (ptr == end)
        return XML_TOK_PARTIAL;
      switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
      default:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      break;
#endif
    case BT_S: case BT_CR: case BT_LF:
      for (;;) {
        int t;

        ptr += MINBPC(enc);
        if (ptr == end)
          return XML_TOK_PARTIAL;
        t = BYTE_TYPE(enc, ptr);
        if (t == BT_EQUALS)
          break;
        switch (t) {
        case BT_S:
        case BT_LF:
        case BT_CR:
          break;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
      }
    /* fall through */
    case BT_EQUALS:
      {
        int open;
#ifdef XML_NS
        hadColon = 0;
#endif
        for (;;) {
          
          ptr += MINBPC(enc);
          if (ptr == end)
            return XML_TOK_PARTIAL;
          open = BYTE_TYPE(enc, ptr);
          if (open == BT_QUOT || open == BT_APOS)
            break;
          switch (open) {
          case BT_S:
          case BT_LF:
          case BT_CR:
            break;
          default:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
        }
        ptr += MINBPC(enc);
        /* in attribute value */
        for (;;) {
          int t;
          if (ptr == end)
            return XML_TOK_PARTIAL;
          t = BYTE_TYPE(enc, ptr);
          if (t == open)
            break;
          switch (t) {
          INVALID_CASES(ptr, nextTokPtr)
          case BT_AMP:
            {
              int tok = PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, &ptr);
              if (tok <= 0) {
                if (tok == XML_TOK_INVALID)
                  *nextTokPtr = ptr;
                return tok;
              }
              break;
            }
          case BT_LT:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          default:
            ptr += MINBPC(enc);
            break;
          }
        }
        ptr += MINBPC(enc);
        if (ptr == end)
          return XML_TOK_PARTIAL;
        switch (BYTE_TYPE(enc, ptr)) {
        case BT_S:
        case BT_CR:
        case BT_LF:
          break;
        case BT_SOL:
          goto sol;
        case BT_GT:
          goto gt;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
        /* ptr points to closing quote */
        for (;;) {
          ptr += MINBPC(enc);
          if (ptr == end)
            return XML_TOK_PARTIAL;
          switch (BYTE_TYPE(enc, ptr)) {
          CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
          case BT_S: case BT_CR: case BT_LF:
            continue;
          case BT_GT:
          gt:
            *nextTokPtr = ptr + MINBPC(enc);
            return XML_TOK_START_TAG_WITH_ATTS;
          case BT_SOL:
          sol:
            ptr += MINBPC(enc);
            if (ptr == end)
              return XML_TOK_PARTIAL;
            if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
              *nextTokPtr = ptr;
              return XML_TOK_INVALID;
            }
            *nextTokPtr = ptr + MINBPC(enc);
            return XML_TOK_EMPTY_ELEMENT_WITH_ATTS;
          default:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
          break;
        }
        break;
      }
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}